

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

pair<int,_bool> __thiscall
cmComputeLinkDepends::AddLinkEntry(cmComputeLinkDepends *this,cmLinkItem *item,int groupIndex)

{
  iterator *piVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  cmGeneratorTarget *pcVar3;
  size_type sVar4;
  _Elt_pointer pBVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  int iVar8;
  EntryKind EVar9;
  string *psVar10;
  char *pcVar11;
  cmValue cVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Rb_tree_color _Var13;
  ulong uVar14;
  pointer this_01;
  basic_string_view<char,_std::char_traits<char>_> __str;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  pair<std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_int>_>,_bool> pVar15;
  BFSEntry qe;
  string var;
  BFSEntry local_a8;
  long local_98;
  char *pcStack_90;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  long *local_78;
  char *local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  long local_58;
  string local_50;
  
  pVar15 = AllocateLinkEntry(this,item);
  if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    _Var13 = pVar15.first._M_node._M_node[3]._M_color;
    uVar14 = 0;
    goto LAB_004b8009;
  }
  _Var13 = pVar15.first._M_node._M_node[3]._M_color;
  local_58 = (long)(int)_Var13;
  this_01 = (this->EntryList).
            super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
            ._M_impl.super__Vector_impl_data._M_start + local_58;
  psVar10 = cmLinkItem::AsStr_abi_cxx11_(item);
  pcVar2 = (psVar10->_M_dataplus)._M_p;
  local_78 = (long *)&local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,pcVar2 + psVar10->_M_string_length);
  local_88 = (item->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  p_Stack_80 = (item->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
               .
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Stack_80->_M_use_count = p_Stack_80->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Stack_80->_M_use_count = p_Stack_80->_M_use_count + 1;
    }
  }
  if (local_78 == (long *)&local_68) {
    pcStack_90 = (char *)uStack_60;
    local_a8._0_8_ = &local_98;
  }
  else {
    local_a8._0_8_ = local_78;
  }
  local_98 = CONCAT71(uStack_67,local_68);
  local_a8.LibDepends = local_70;
  local_70 = (char *)0x0;
  local_68 = 0;
  local_78 = (long *)&local_68;
  std::__cxx11::string::operator=((string *)this_01,(string *)&local_a8);
  p_Var7 = p_Stack_80;
  peVar6 = local_88;
  local_88 = (element_type *)0x0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            ((long)&(this_01->Item).Backtrace.
                    super_cmConstStack<cmListFileContext,_cmListFileBacktrace> + 8))->_M_pi;
  (this_01->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar6;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(this_01->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace> + 8))
  ->_M_pi = p_Var7;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
  }
  if ((long *)local_a8._0_8_ != &local_98) {
    operator_delete((void *)local_a8._0_8_,local_98 + 1);
  }
  if (local_78 != (long *)&local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  pcVar3 = item->Target;
  this_01->Target = pcVar3;
  pcVar11 = (this_01->Item).Value._M_dataplus._M_p;
  if (((pcVar3 == (cmGeneratorTarget *)0x0) && (*pcVar11 == '-')) && (pcVar11[1] != 'l')) {
    std::__cxx11::string::substr((ulong)&local_a8,(ulong)this_01);
    iVar8 = std::__cxx11::string::compare((char *)&local_a8);
    if ((long *)local_a8._0_8_ != &local_98) {
      operator_delete((void *)local_a8._0_8_,local_98 + 1);
    }
    EVar9 = Flag;
    if (iVar8 == 0) {
      pcVar11 = (this_01->Item).Value._M_dataplus._M_p;
      goto LAB_004b7e66;
    }
LAB_004b7eaa:
    this_01->Kind = EVar9;
  }
  else {
LAB_004b7e66:
    local_a8._0_8_ = (this_01->Item).Value._M_string_length;
    __str._M_str = DAT_008912b8;
    __str._M_len = (anonymous_namespace)::LG_BEGIN;
    local_a8.LibDepends = pcVar11;
    iVar8 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      ((basic_string_view<char,_std::char_traits<char>_> *)&local_a8,0,
                       (anonymous_namespace)::LG_BEGIN,__str);
    if (((iVar8 == 0) && (sVar4 = (this_01->Item).Value._M_string_length, sVar4 != 0)) &&
       (EVar9 = Group, *(char *)(*(long *)&(this_01->Item).Value._M_dataplus + -1 + sVar4) == '>'))
    goto LAB_004b7eaa;
  }
  uVar14 = 0x100000000;
  if (this_01->Kind != Group) {
    if (this_01->Target == (cmGeneratorTarget *)0x0) {
      local_a8.LibDepends = (this_01->Item).Value._M_dataplus._M_p;
      local_a8._0_8_ = (this_01->Item).Value._M_string_length;
      local_98 = 0xc;
      pcStack_90 = "_LIB_DEPENDS";
      views._M_len = 2;
      views._M_array = (iterator)&local_a8;
      cmCatViews_abi_cxx11_(&local_50,views);
      cVar12 = cmMakefile::GetDefinition(this->Makefile,&local_50);
      if (cVar12.Value == (string *)0x0) {
        if (this_01->Kind != Flag) {
          (this->InferredDependSets).
          super__Vector_base<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
          ._M_impl.super__Vector_impl_data._M_start[local_58].Initialized = true;
        }
      }
      else {
        local_a8.GroupIndex = groupIndex;
        local_a8.Index = _Var13;
        local_a8.LibDepends = ((cVar12.Value)->_M_dataplus)._M_p;
        pBVar5 = (this->BFSQueue).c.
                 super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pBVar5 == (this->BFSQueue).c.
                      super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>
          ::_M_push_back_aux<cmComputeLinkDepends::BFSEntry_const&>
                    ((deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>
                      *)&this->BFSQueue,&local_a8);
        }
        else {
          pBVar5->Index = _Var13;
          pBVar5->GroupIndex = groupIndex;
          pBVar5->LibDepends = local_a8.LibDepends;
          piVar1 = &(this->BFSQueue).c.
                    super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                    ._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_a8.GroupIndex = groupIndex;
      local_a8.Index = _Var13;
      local_a8.LibDepends = (char *)0x0;
      pBVar5 = (this->BFSQueue).c.
               super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pBVar5 == (this->BFSQueue).c.
                    super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>::
        _M_push_back_aux<cmComputeLinkDepends::BFSEntry_const&>
                  ((deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>
                    *)&this->BFSQueue,&local_a8);
      }
      else {
        pBVar5->Index = _Var13;
        pBVar5->GroupIndex = groupIndex;
        pBVar5->LibDepends = (char *)0x0;
        piVar1 = &(this->BFSQueue).c.
                  super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                  ._M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
    }
  }
LAB_004b8009:
  return (pair<int,_bool>)(_Var13 | uVar14);
}

Assistant:

std::pair<int, bool> cmComputeLinkDepends::AddLinkEntry(cmLinkItem const& item,
                                                        int groupIndex)
{
  // Allocate a spot for the item entry.
  auto lei = this->AllocateLinkEntry(item);

  // Check if the item entry has already been added.
  if (!lei.second) {
    // Yes.  We do not need to follow the item's dependencies again.
    return { lei.first->second, false };
  }

  // Initialize the item entry.
  int index = lei.first->second;
  LinkEntry& entry = this->EntryList[index];
  entry.Item = BT<std::string>(item.AsStr(), item.Backtrace);
  entry.Target = item.Target;
  if (!entry.Target && entry.Item.Value[0] == '-' &&
      entry.Item.Value[1] != 'l' &&
      entry.Item.Value.substr(0, 10) != "-framework") {
    entry.Kind = LinkEntry::Flag;
  } else if (cmHasPrefix(entry.Item.Value, LG_BEGIN) &&
             cmHasSuffix(entry.Item.Value, '>')) {
    entry.Kind = LinkEntry::Group;
  }

  if (entry.Kind != LinkEntry::Group) {
    // If the item has dependencies queue it to follow them.
    if (entry.Target) {
      // Target dependencies are always known.  Follow them.
      BFSEntry qe = { index, groupIndex, nullptr };
      this->BFSQueue.push(qe);
    } else {
      // Look for an old-style <item>_LIB_DEPENDS variable.
      std::string var = cmStrCat(entry.Item.Value, "_LIB_DEPENDS");
      if (cmValue val = this->Makefile->GetDefinition(var)) {
        // The item dependencies are known.  Follow them.
        BFSEntry qe = { index, groupIndex, val->c_str() };
        this->BFSQueue.push(qe);
      } else if (entry.Kind != LinkEntry::Flag) {
        // The item dependencies are not known.  We need to infer them.
        this->InferredDependSets[index].Initialized = true;
      }
    }
  }

  return { index, true };
}